

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t ismode(char *start,char *end,wchar_t *permset)

{
  char cVar1;
  char *pcVar2;
  char *local_30;
  char *p;
  wchar_t *permset_local;
  char *end_local;
  char *start_local;
  
  if (start < end) {
    *permset = L'\0';
    local_30 = start;
    while (local_30 < end) {
      pcVar2 = local_30 + 1;
      cVar1 = *local_30;
      local_30 = pcVar2;
      if (cVar1 != '-') {
        if (cVar1 == 'R') {
LAB_0098b89d:
          *permset = *permset | 4;
        }
        else if (cVar1 == 'W') {
LAB_0098b8aa:
          *permset = *permset | 2;
        }
        else {
          if (cVar1 != 'X') {
            if (cVar1 == 'r') goto LAB_0098b89d;
            if (cVar1 == 'w') goto LAB_0098b8aa;
            if (cVar1 != 'x') {
              return L'\0';
            }
          }
          *permset = *permset | 1;
        }
      }
    }
    start_local._4_4_ = L'\x01';
  }
  else {
    start_local._4_4_ = L'\0';
  }
  return start_local._4_4_;
}

Assistant:

static int
ismode(const char *start, const char *end, int *permset)
{
	const char *p;

	if (start >= end)
		return (0);
	p = start;
	*permset = 0;
	while (p < end) {
		switch (*p++) {
		case 'r': case 'R':
			*permset |= ARCHIVE_ENTRY_ACL_READ;
			break;
		case 'w': case 'W':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE;
			break;
		case 'x': case 'X':
			*permset |= ARCHIVE_ENTRY_ACL_EXECUTE;
			break;
		case '-':
			break;
		default:
			return (0);
		}
	}
	return (1);
}